

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Converter.cpp
# Opt level: O3

string * __thiscall
UtfConverter::toUtf8_abi_cxx11_
          (string *__return_storage_ptr__,UtfConverter *this,uint8_t *start,size_t numBytes,
          SourceFormat srcFormat)

{
  undefined4 *puVar1;
  code *pcVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *vec_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_01;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *vec_02;
  undefined4 in_register_00000084;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  void *local_190 [2];
  long local_180;
  
  switch((int)numBytes) {
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<unsigned_char_const*>
              ((string *)__return_storage_ptr__,this,start + (long)this);
    return __return_storage_ptr__;
  case 2:
    pcVar2 = anon_unknown.dwarf_4071b1::read_le16;
    (anonymous_namespace)::make_vector<unsigned_short(*)(unsigned_char_const*)>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_190,
               (_anonymous_namespace_ *)this,start,0x1e77b0,
               (_func_unsigned_short_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)local_190,vec_02,pcVar2);
    break;
  case 3:
    pcVar2 = anon_unknown.dwarf_4071b1::read_be16;
    (anonymous_namespace)::make_vector<unsigned_short(*)(unsigned_char_const*)>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_190,
               (_anonymous_namespace_ *)this,start,0x1e77a8,
               (_func_unsigned_short_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)local_190,vec_00,pcVar2);
    break;
  case 4:
    pcVar2 = anon_unknown.dwarf_4071b1::read_le32;
    (anonymous_namespace)::make_vector<unsigned_int(*)(unsigned_char_const*)>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_190,
               (_anonymous_namespace_ *)this,start,0x1e7b25,
               (_func_uint_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_int,convertUTF::ConversionResult(*)(unsigned_int_const**,unsigned_int_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)local_190,vec_01,pcVar2);
    break;
  case 5:
    pcVar2 = anon_unknown.dwarf_4071b1::read_be32;
    (anonymous_namespace)::make_vector<unsigned_int(*)(unsigned_char_const*)>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_190,
               (_anonymous_namespace_ *)this,start,0x1e7b20,
               (_func_uint_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_int,convertUTF::ConversionResult(*)(unsigned_int_const**,unsigned_int_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)local_190,vec,pcVar2);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Unknown parameter to UtfConverter::toUtf8",0x29);
    puVar1 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar1 = 3;
    *(undefined4 **)(puVar1 + 2) = puVar1 + 6;
    if (local_1b0 == &local_1a0) {
      puVar1[6] = local_1a0;
      puVar1[7] = uStack_19c;
      puVar1[8] = uStack_198;
      puVar1[9] = uStack_194;
    }
    else {
      *(uint **)(puVar1 + 2) = local_1b0;
      *(ulong *)(puVar1 + 6) = CONCAT44(uStack_19c,local_1a0);
    }
    *(undefined8 *)(puVar1 + 4) = local_1a8;
    local_1a0 = local_1a0 & 0xffffff00;
    __cxa_throw(puVar1,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (local_190[0] != (void *)0x0) {
    operator_delete(local_190[0],local_180 - (long)local_190[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUtf8(const uint8_t *start, const size_t numBytes, const SourceFormat srcFormat)
{
    switch (srcFormat)
    {
    case SourceFormat::sfUTF8:
        return {start, start + numBytes};
    case SourceFormat::sfUTF16be:
        return from_utf_nn(make_vector(start, numBytes, read_be16), ConvertUTF16toUTF8);
    case SourceFormat::sfUTF16le:
        return from_utf_nn(make_vector(start, numBytes, read_le16), ConvertUTF16toUTF8);
    case SourceFormat::sfUTF32be:
        return from_utf_nn(make_vector(start, numBytes, read_be32), ConvertUTF32toUTF8);
    case SourceFormat::sfUTF32le:
        return from_utf_nn(make_vector(start, numBytes, read_le32), ConvertUTF32toUTF8);
#ifdef _WIN32
    case SourceFormat::sfANSI:
    {
        return ::toUtf8(fromAcp(reinterpret_cast<const char *>(start), static_cast<int>(numBytes)).data());
    }
#endif
    default:
        THROW(ERR_COMMON, "Unknown parameter to UtfConverter::toUtf8")
    }
}